

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataViewDefault.cpp
# Opt level: O3

void __thiscall Rml::DataViewText::DataViewText(DataViewText *this,Element *element)

{
  DataView::DataView(&this->super_DataView,element,0);
  (this->super_DataView).super_Releasable._vptr_Releasable =
       (_func_int **)&PTR__DataViewText_0032e890;
  (this->text)._M_dataplus._M_p = (pointer)&(this->text).field_2;
  (this->text)._M_string_length = 0;
  (this->text).field_2._M_local_buf[0] = '\0';
  (this->data_entries).
  super__Vector_base<Rml::DataViewText::DataEntry,_std::allocator<Rml::DataViewText::DataEntry>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->data_entries).
  super__Vector_base<Rml::DataViewText::DataEntry,_std::allocator<Rml::DataViewText::DataEntry>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->data_entries).
  super__Vector_base<Rml::DataViewText::DataEntry,_std::allocator<Rml::DataViewText::DataEntry>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

DataViewText::DataViewText(Element* element) : DataView(element, 0) {}